

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::EncodableOpnd<long>::DumpEncodable(EncodableOpnd<long> *this)

{
  EncodableOpnd<long> *this_local;
  
  if (this->name == (char16 *)0x0) {
    if (this->decodedValue == 0) {
      Output::Print(L"%lld (0x%llX)",this->m_value,this->m_value);
    }
    else {
      Output::Print(L"%lld (0x%llX) [encoded: 0x%llX]",this->decodedValue,this->decodedValue,
                    this->m_value);
    }
  }
  else {
    Output::Print(L"<%s> (value: 0x%llX)",this->name,this->m_value);
  }
  return;
}

Assistant:

void EncodableOpnd<int64>::DumpEncodable() const
{
    if (name != nullptr)
    {
        Output::Print(_u("<%s> (value: 0x%llX)"), name, m_value);
    }
    else if (decodedValue != 0)
    {
        Output::Print(_u("%lld (0x%llX) [encoded: 0x%llX]"), decodedValue, decodedValue, m_value);
    }
    else
    {
        Output::Print(_u("%lld (0x%llX)"), m_value, m_value);
    }
}